

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O0

size_t FSE_decompress_wksp(void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,
                          FSE_DTable *workSpace,uint maxLog)

{
  uint uVar1;
  size_t code;
  undefined8 in_RSI;
  short *in_RDI;
  uint in_R9D;
  size_t e;
  size_t NCountLength;
  uint maxSymbolValue;
  uint tableLog;
  short counting [256];
  BYTE *ip;
  BYTE *istart;
  undefined4 local_24c;
  size_t in_stack_fffffffffffffdd8;
  void *in_stack_fffffffffffffde0;
  FSE_DTable *in_stack_fffffffffffffde8;
  uint *in_stack_fffffffffffffdf0;
  short *in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  void *in_stack_fffffffffffffe08;
  FSE_DTable *in_stack_fffffffffffffff8;
  
  code = FSE_readNCount(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                        in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                        in_stack_fffffffffffffdd8);
  uVar1 = ERR_isError(code);
  if (uVar1 == 0) {
    if (in_R9D < local_24c) {
      code = 0xffffffffffffffd4;
    }
    else {
      code = FSE_buildDTable(in_stack_fffffffffffffff8,in_RDI,(uint)((ulong)in_RSI >> 0x20),
                             (uint)in_RSI);
      uVar1 = ERR_isError(code);
      if (uVar1 == 0) {
        code = FSE_decompress_usingDTable
                         (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                          in_stack_fffffffffffffdf8,(size_t)in_stack_fffffffffffffdf0,
                          in_stack_fffffffffffffde8);
      }
    }
  }
  return code;
}

Assistant:

size_t FSE_decompress_wksp(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, FSE_DTable* workSpace, unsigned maxLog)
{
    const BYTE* const istart = (const BYTE*)cSrc;
    const BYTE* ip = istart;
    short counting[FSE_MAX_SYMBOL_VALUE+1];
    unsigned tableLog;
    unsigned maxSymbolValue = FSE_MAX_SYMBOL_VALUE;

    /* normal FSE decoding mode */
    size_t const NCountLength = FSE_readNCount (counting, &maxSymbolValue, &tableLog, istart, cSrcSize);
    if (FSE_isError(NCountLength)) return NCountLength;
    //if (NCountLength >= cSrcSize) return ERROR(srcSize_wrong);   /* too small input size; supposed to be already checked in NCountLength, only remaining case : NCountLength==cSrcSize */
    if (tableLog > maxLog) return ERROR(tableLog_tooLarge);
    ip += NCountLength;
    cSrcSize -= NCountLength;

    CHECK_F( FSE_buildDTable (workSpace, counting, maxSymbolValue, tableLog) );

    return FSE_decompress_usingDTable (dst, dstCapacity, ip, cSrcSize, workSpace);   /* always return, even if it is an error code */
}